

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::(anonymous_namespace)::passthrough_clipper<float>::
line_to<agge::rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,agge::tests::(anonymous_namespace)::scaling_r<3,1>>>
          (passthrough_clipper<float> *this,
          rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<3,_1>_>
          *sink,float x,float y)

{
  float y_local;
  float x_local;
  rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<3,_1>_>
  *sink_local;
  passthrough_clipper<float> *this_local;
  
  rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<3,_1>_>
  ::line(sink,*(coord_type *)this,*(coord_type *)(this + 4),x,y);
  anon_unknown_2::passthrough_clipper<float>::move_to((passthrough_clipper<float> *)this,x,y);
  return;
}

Assistant:

void line_to(LinesSinkT &sink, T x, T y)
				{
					sink.line(_last_x, _last_y, x, y);
					move_to(x, y);
				}